

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BOCC-CTA-cs16btech11038.cpp
# Opt level: O1

ssize_t __thiscall BOCC_CTA::read(BOCC_CTA *this,int __fd,void *__buf,size_t __nbytes)

{
  pointer __nbytes_00;
  DataItem *pDVar1;
  char cVar2;
  int iVar3;
  mapped_type *ppTVar4;
  void *__buf_00;
  int __fd_00;
  ssize_t sVar5;
  set<Transaction_*,_TransCompare,_std::allocator<Transaction_*>_> *this_00;
  pair<std::_Rb_tree_iterator<Transaction_*>,_std::_Rb_tree_iterator<Transaction_*>_> pVar6;
  Transaction *cur;
  Transaction *local_40;
  int local_34;
  
  local_34 = __fd;
  std::__shared_mutex_pthread::lock_shared(&(this->scheduler_lock)._M_impl);
  __fd_00 = (int)__buf;
  iVar3 = pthread_mutex_lock((pthread_mutex_t *)
                             &(this->dataItems).
                              super__Vector_base<DataItem_*,_std::allocator<DataItem_*>_>._M_impl.
                              super__Vector_impl_data._M_start[__fd_00]->lock);
  if (iVar3 == 0) {
    ppTVar4 = std::__detail::
              _Map_base<int,_std::pair<const_int,_Transaction_*>,_std::allocator<std::pair<const_int,_Transaction_*>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
              ::operator[]((_Map_base<int,_std::pair<const_int,_Transaction_*>,_std::allocator<std::pair<const_int,_Transaction_*>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                            *)&this->transactions,&local_34);
    local_40 = *ppTVar4;
    iVar3 = pthread_mutex_lock((pthread_mutex_t *)&local_40->t_status_mtx);
    if (iVar3 == 0) {
      cVar2 = Transaction::getStatus(local_40);
      __nbytes_00 = (this->dataItems).super__Vector_base<DataItem_*,_std::allocator<DataItem_*>_>.
                    _M_impl.super__Vector_impl_data._M_start;
      pDVar1 = __nbytes_00[__fd_00];
      if (cVar2 == 'a') {
        this_00 = &pDVar1->read_list;
        pVar6 = std::
                _Rb_tree<Transaction_*,_Transaction_*,_std::_Identity<Transaction_*>,_TransCompare,_std::allocator<Transaction_*>_>
                ::equal_range(&this_00->_M_t,&local_40);
        std::
        _Rb_tree<Transaction_*,_Transaction_*,_std::_Identity<Transaction_*>,_TransCompare,_std::allocator<Transaction_*>_>
        ::_M_erase_aux(&this_00->_M_t,(_Base_ptr)pVar6.first._M_node,(_Base_ptr)pVar6.second._M_node
                      );
        sVar5 = 0xfffffffe;
      }
      else {
        *(int *)__nbytes = pDVar1->value;
        Transaction::read(local_40,__fd_00,__buf_00,(size_t)__nbytes_00);
        sVar5 = 0;
      }
      pthread_mutex_unlock((pthread_mutex_t *)&local_40->t_status_mtx);
      pthread_mutex_unlock
                ((pthread_mutex_t *)
                 &(this->dataItems).super__Vector_base<DataItem_*,_std::allocator<DataItem_*>_>.
                  _M_impl.super__Vector_impl_data._M_start[__fd_00]->lock);
      pthread_rwlock_unlock((pthread_rwlock_t *)&this->scheduler_lock);
      return sVar5;
    }
  }
  std::__throw_system_error(iVar3);
}

Assistant:

int BOCC_CTA::read(int tid, int dIdx, int *store) {
    scheduler_lock.lock_shared();
    dataItems[dIdx]->lock.lock();

    Transaction *cur = transactions[tid];
    cur->t_status_mtx.lock();

    if(cur->getStatus()=='a'){

        // remove this transaction from the read list of this data item.
        dataItems[dIdx]->read_list.erase(cur);

        cur->t_status_mtx.unlock();
        dataItems[dIdx]->lock.unlock();
        scheduler_lock.unlock_shared();

        return -2;
    }

    DataItem* curItem = dataItems[dIdx];
    //curItem->read_list.insert(cur);
    *store = curItem->value;
    // This function just adds dIdx to the readSet!
    cur->read(dIdx);

    cur->t_status_mtx.unlock();
    dataItems[dIdx]->lock.unlock();
    scheduler_lock.unlock_shared();

    return 0;
}